

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::SubroutineSymbol::inheritDefaultedArgList
          (SubroutineSymbol *this,Scope *scope,Scope *parentScope,SyntaxNode *syntax,
          SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *arguments)

{
  Symbol *pSVar1;
  __fn *__fn;
  SourceLocation this_00;
  size_t sVar2;
  pointer ppFVar3;
  FormalArgumentSymbol *this_01;
  int iVar4;
  SubroutineSymbol *pSVar5;
  Expression *this_02;
  undefined4 extraout_var;
  Diagnostic *this_03;
  Scope *pSVar6;
  SyntaxNode *pSVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  long lVar8;
  byte bVar9;
  SourceRange sourceRange;
  LocalVarCheckVisitor visitor;
  LocalVarCheckVisitor local_58;
  
  pSVar1 = scope->thisSym;
  if (pSVar1->kind == ClassType) {
    __fn = *(__fn **)&this->super_Symbol;
    pSVar7 = syntax;
    if (pSVar1[1].indexInScope != 0) {
      Scope::elaborate((Scope *)&pSVar1[1].name);
    }
    this_00 = pSVar1[2].location;
    if (this_00 == (SourceLocation)0x0) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)parentScope);
      this_03 = Scope::addDiag((Scope *)this,(DiagCode)0x2f000a,sourceRange);
      Diagnostic::operator<<(this_03,pSVar1->name);
      return;
    }
    if (*(Type **)((long)this_00 + 0x40) == (Type *)0x0) {
      Type::resolveCanonical((Type *)this_00);
    }
    if (((*(Type **)((long)this_00 + 0x40))->super_Symbol).kind == ClassType) {
      pSVar5 = ClassType::getConstructor(*(ClassType **)((long)this_00 + 0x40));
      if (pSVar5 != (SubroutineSymbol *)0x0) {
        if ((pSVar5->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&pSVar5->super_Scope);
        }
        sVar2 = (pSVar5->arguments)._M_extent._M_extent_value;
        if (sVar2 != 0) {
          ppFVar3 = (pSVar5->arguments)._M_ptr;
          lVar8 = 0;
          bVar9 = 0;
          do {
            iVar4 = (int)pSVar7;
            this_01 = *(FormalArgumentSymbol **)((long)ppFVar3 + lVar8);
            this_02 = FormalArgumentSymbol::getDefaultValue(this_01);
            __child_stack = extraout_RDX;
            if (((this_02 != (Expression *)0x0) && ((bVar9 & 1) == 0)) &&
               ((this_01->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len != 0)) {
              local_58.argName._M_len =
                   (this_01->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
              local_58.argName._M_str =
                   (this_01->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
              local_58.anyErrors = false;
              pSVar6 = parentScope;
              local_58.scope = (Scope *)this;
              local_58.syntax = (SyntaxNode *)parentScope;
              Expression::
              visitExpression<slang::ast::Expression_const,slang::ast::LocalVarCheckVisitor&>
                        (this_02,this_02,&local_58);
              iVar4 = (int)pSVar6;
              bVar9 = bVar9 | local_58.anyErrors;
              __child_stack = extraout_RDX_00;
            }
            iVar4 = FormalArgumentSymbol::clone(this_01,__fn,__child_stack,iVar4,arguments);
            pSVar7 = (SyntaxNode *)0x0;
            arguments = (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)0x1;
            Scope::insertMember((Scope *)this,(Symbol *)CONCAT44(extraout_var,iVar4),
                                (Symbol *)(this->super_Symbol).parentScope,false,true);
            local_58.scope = (Scope *)CONCAT44(extraout_var,iVar4);
            SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
            emplace_back<slang::ast::FormalArgumentSymbol_const*>
                      ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)syntax,
                       (FormalArgumentSymbol **)&local_58);
            lVar8 = lVar8 + 8;
          } while (sVar2 << 3 != lVar8);
        }
      }
    }
  }
  return;
}

Assistant:

void SubroutineSymbol::inheritDefaultedArgList(
    Scope& scope, const Scope& parentScope, const SyntaxNode& syntax,
    SmallVectorBase<const FormalArgumentSymbol*>& arguments) {

    auto& comp = scope.getCompilation();
    if (parentScope.asSymbol().kind == SymbolKind::ClassType) {
        auto& ct = parentScope.asSymbol().as<ClassType>();
        auto baseClass = ct.getBaseClass();
        if (!baseClass) {
            scope.addDiag(diag::SuperNoBase, syntax.sourceRange()) << ct.name;
        }
        else if (baseClass->isClass()) {
            // Note: we check isClass() above to skip over cases where
            // the baseClass is the ErrorType.
            auto& baseCt = baseClass->getCanonicalType().as<ClassType>();
            if (auto constructor = baseCt.getConstructor()) {
                // We found the base class's constructor.
                // Pull in all arguments from it.
                bool anyErrors = false;
                for (auto arg : constructor->getArguments()) {
                    // It's an error if any of the inherited arguments
                    // have default values that refer to local members
                    // of the parent class.
                    if (auto defVal = arg->getDefaultValue();
                        !anyErrors && defVal && !arg->name.empty()) {
                        LocalVarCheckVisitor visitor(scope, syntax, arg->name);
                        defVal->visit(visitor);
                        anyErrors |= visitor.anyErrors;
                    }

                    auto& cloned = arg->clone(comp);
                    scope.addMember(cloned);
                    arguments.push_back(&cloned);
                }
            }
        }
    }
}